

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O3

void __thiscall leveldb::TableBuilder::Flush(TableBuilder *this)

{
  Rep *pRVar1;
  char *pcVar2;
  bool bVar3;
  char *in_RAX;
  Status local_18;
  
  pRVar1 = this->rep_;
  if (pRVar1->closed == true) {
    __assert_fail("!r->closed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                  ,0x7f,"void leveldb::TableBuilder::Flush()");
  }
  local_18.state_ = in_RAX;
  bVar3 = ok(this);
  if ((bVar3) && ((pRVar1->data_block).buffer_._M_string_length != 0)) {
    if (pRVar1->pending_index_entry == true) {
      __assert_fail("!r->pending_index_entry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                    ,0x82,"void leveldb::TableBuilder::Flush()");
    }
    WriteBlock(this,&pRVar1->data_block,&pRVar1->pending_handle);
    bVar3 = ok(this);
    if (bVar3) {
      pRVar1->pending_index_entry = true;
      (*pRVar1->file->_vptr_WritableFile[4])(&local_18);
      pcVar2 = (pRVar1->status).state_;
      (pRVar1->status).state_ = local_18.state_;
      local_18.state_ = pcVar2;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
    }
    if (pRVar1->filter_block != (FilterBlockBuilder *)0x0) {
      FilterBlockBuilder::StartBlock(pRVar1->filter_block,pRVar1->offset);
    }
  }
  return;
}

Assistant:

void TableBuilder::Flush() {
  Rep* r = rep_;
  assert(!r->closed);
  if (!ok()) return;
  if (r->data_block.empty()) return;
  assert(!r->pending_index_entry);
  WriteBlock(&r->data_block, &r->pending_handle);
  if (ok()) {
    r->pending_index_entry = true;
    r->status = r->file->Flush();
  }
  if (r->filter_block != nullptr) {
    r->filter_block->StartBlock(r->offset);
  }
}